

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpm_comm_emulator.c
# Opt level: O0

int power_on_simulator(TPM_COMM_INFO *tpm_comm_info)

{
  int iVar1;
  uint32_t uVar2;
  LOGGER_LOG p_Var3;
  LOGGER_LOG l_6;
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG p_Stack_38;
  uint32_t ack_value;
  LOGGER_LOG l_1;
  uint32_t signal_nv_cmd;
  uint32_t power_on_cmd;
  LOGGER_LOG l;
  TPM_SOCKET_HANDLE platform_conn;
  TPM_COMM_INFO *pTStack_10;
  int result;
  TPM_COMM_INFO *tpm_comm_info_local;
  
  pTStack_10 = tpm_comm_info;
  l = (LOGGER_LOG)tpm_socket_create(tpm_comm_info->socket_ip,0x912);
  if ((TPM_SOCKET_HANDLE)l == (TPM_SOCKET_HANDLE)0x0) {
    _signal_nv_cmd = xlogging_get_log_function();
    if (_signal_nv_cmd != (LOGGER_LOG)0x0) {
      (*_signal_nv_cmd)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/src/tpm_comm_emulator.c"
                        ,"power_on_simulator",0x67,1,
                        "Failure: connecting to tpm simulator platform interface.");
    }
    platform_conn._4_4_ = 0x68;
  }
  else {
    l_1._4_4_ = htonl(1);
    l_1._0_4_ = htonl(0xb);
    iVar1 = tpm_socket_send((TPM_SOCKET_HANDLE)l,(uchar *)((long)&l_1 + 4),4);
    if (iVar1 == 0) {
      iVar1 = tpm_socket_read((TPM_SOCKET_HANDLE)l,(uchar *)((long)&l_2 + 4),4);
      if (iVar1 == 0) {
        uVar2 = htonl(l_2._4_4_);
        if (uVar2 == 0) {
          iVar1 = tpm_socket_send((TPM_SOCKET_HANDLE)l,(uchar *)&l_1,4);
          if (iVar1 == 0) {
            iVar1 = tpm_socket_read((TPM_SOCKET_HANDLE)l,(uchar *)((long)&l_2 + 4),4);
            if (iVar1 == 0) {
              uVar2 = htonl(l_2._4_4_);
              if (uVar2 == 0) {
                platform_conn._4_4_ = 0;
              }
              else {
                p_Var3 = xlogging_get_log_function();
                if (p_Var3 != (LOGGER_LOG)0x0) {
                  (*p_Var3)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/src/tpm_comm_emulator.c"
                            ,"power_on_simulator",0x95,1,"Failure reading cmd sync.");
                }
                platform_conn._4_4_ = 0x96;
              }
            }
            else {
              p_Var3 = xlogging_get_log_function();
              if (p_Var3 != (LOGGER_LOG)0x0) {
                (*p_Var3)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/src/tpm_comm_emulator.c"
                          ,"power_on_simulator",0x8e,1,"Failure sending remote handshake.");
              }
              platform_conn._4_4_ = 0x8f;
            }
          }
          else {
            p_Var3 = xlogging_get_log_function();
            if (p_Var3 != (LOGGER_LOG)0x0) {
              (*p_Var3)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/src/tpm_comm_emulator.c"
                        ,"power_on_simulator",0x87,1,"Failure sending remote handshake.");
            }
            platform_conn._4_4_ = 0x88;
          }
        }
        else {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/src/tpm_comm_emulator.c"
                      ,"power_on_simulator",0x80,1,"Failure reading cmd sync.");
          }
          platform_conn._4_4_ = 0x81;
        }
      }
      else {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/src/tpm_comm_emulator.c"
                    ,"power_on_simulator",0x79,1,"Failure sending remote handshake.");
        }
        platform_conn._4_4_ = 0x7a;
      }
    }
    else {
      p_Stack_38 = xlogging_get_log_function();
      if (p_Stack_38 != (LOGGER_LOG)0x0) {
        (*p_Stack_38)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/src/tpm_comm_emulator.c"
                      ,"power_on_simulator",0x71,1,"Failure sending remote handshake.");
      }
      platform_conn._4_4_ = 0x72;
    }
    tpm_socket_destroy((TPM_SOCKET_HANDLE)l);
  }
  return platform_conn._4_4_;
}

Assistant:

static int power_on_simulator(TPM_COMM_INFO* tpm_comm_info)
{
    int result;
    TPM_SOCKET_HANDLE platform_conn;

    if ((platform_conn = tpm_socket_create(tpm_comm_info->socket_ip, TPM_SIMULATOR_PLATFORM_PORT) ) == NULL)
    {
        LogError("Failure: connecting to tpm simulator platform interface.");
        result = MU_FAILURE;
    }
    else
    {
        uint32_t power_on_cmd = htonl(REMOTE_SIGNAL_POWER_ON_CMD);
        uint32_t signal_nv_cmd = htonl(REMOTE_SIGNAL_NV_ON_CMD);

        if (tpm_socket_send(platform_conn, (const unsigned char*)&power_on_cmd, sizeof(power_on_cmd) ) != 0)
        {
            LogError("Failure sending remote handshake.");
            result = MU_FAILURE;
        }
        else
        {
            uint32_t ack_value;
            if (tpm_socket_read(platform_conn, (unsigned char*)&ack_value, sizeof(uint32_t)) != 0)
            {
                LogError("Failure sending remote handshake.");
                result = MU_FAILURE;
            }
            else
            {
                if (htonl(ack_value) != 0)
                {
                    LogError("Failure reading cmd sync.");
                    result = MU_FAILURE;
                }
                else
                {
                    if (tpm_socket_send(platform_conn, (const unsigned char*)&signal_nv_cmd, sizeof(signal_nv_cmd) ) != 0)
                    {
                        LogError("Failure sending remote handshake.");
                        result = MU_FAILURE;
                    }
                    else
                    {
                        if (tpm_socket_read(platform_conn, (unsigned char*)&ack_value, sizeof(uint32_t)) != 0)
                        {
                            LogError("Failure sending remote handshake.");
                            result = MU_FAILURE;
                        }
                        else
                        {
                            if (htonl(ack_value) != 0)
                            {
                                LogError("Failure reading cmd sync.");
                                result = MU_FAILURE;
                            }
                            else
                            {
                                result = 0;
                            }
                        }
                    }
                }
            }
        }
        tpm_socket_destroy(platform_conn);
    }
    return result;
}